

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O1

GetAddressInfoResponseStruct *
cfd::js::api::AddressApiBase::GetAddressInfo
          (GetAddressInfoResponseStruct *__return_storage_ptr__,GetAddressInfoRequestStruct *request
          ,AddressFactory *address_factory,Address *address_data)

{
  pointer *ppuVar1;
  void *__dest;
  ulong uVar2;
  Address address;
  long *local_1f8;
  long local_1e8 [3];
  Script local_1d0;
  string local_198 [8];
  int local_190;
  undefined1 *local_188;
  undefined1 local_178 [16];
  void *local_168;
  long local_160;
  void *local_150;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::AddressFactory::GetAddress(local_198);
  if (address_data != (Address *)0x0) {
    cfd::core::Address::operator=(address_data,(Address *)local_198);
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  core::Script::~Script(&local_1d0);
  ConvertAddressTypeString_abi_cxx11_(0);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,(string *)&local_1d0)
  ;
  ppuVar1 = (pointer *)
            ((long)&local_1d0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (local_1d0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1d0._vptr_Script);
  }
  __return_storage_ptr__->witness_version = local_190;
  if (local_190 < 0) {
    local_1d0._vptr_Script = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"witnessVersion","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&__return_storage_ptr__->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0);
    if (local_1d0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_1d0._vptr_Script);
    }
  }
  local_1e8[0] = 0;
  uVar2 = local_160 - (long)local_168;
  if (uVar2 == 0) {
    __dest = (void *)0x0;
  }
  else {
    if ((long)uVar2 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar2);
  }
  local_1e8[0] = uVar2 + (long)__dest;
  if (local_160 - (long)local_168 != 0) {
    memmove(__dest,local_168,local_160 - (long)local_168);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash,(string *)&local_1d0);
  if (local_1d0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1d0._vptr_Script);
  }
  if (__dest != (void *)0x0) {
    operator_delete(__dest);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  core::Script::~Script(&local_90);
  local_120[0] = cfd::core::Privkey::Privkey;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8);
  core::TapBranch::~TapBranch((TapBranch *)local_120);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return __return_storage_ptr__;
}

Assistant:

GetAddressInfoResponseStruct AddressApiBase::GetAddressInfo(
    const GetAddressInfoRequestStruct& request,
    const AddressFactory* address_factory, Address* address_data) {
  GetAddressInfoResponseStruct response;
  Address address = address_factory->GetAddress(request.address);
  if (address_data != nullptr) *address_data = address;

  response.locking_script = address.GetLockingScript().GetHex();
  response.hash_type = ConvertAddressTypeText(address.GetAddressType());
  response.witness_version = static_cast<int32_t>(address.GetWitnessVersion());
  if (response.witness_version < 0) {
    response.ignore_items.insert("witnessVersion");
  }
  response.hash = address.GetHash().GetHex();
  return response;
}